

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QControlledGate2.cpp
# Opt level: O2

void __thiscall
qclab::qgates::QControlledGate2<float>::apply
          (QControlledGate2<float> *this,Op op,int nbQubits,
          vector<float,_std::allocator<float>_> *vector,int offset)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  vector<int,_std::allocator<int>_> qubits;
  anon_class_24_5_e9a28bf2 f;
  SquareMatrix<float> local_70;
  _Vector_base<int,_std::allocator<int>_> local_60;
  anon_class_24_5_e9a28bf2 local_48;
  
  (*(this->super_QGate2<float>).super_QObject<float>._vptr_QObject[5])(&local_60,this);
  *(ulong *)local_60._M_impl.super__Vector_impl_data._M_start =
       CONCAT44(offset + (int)((ulong)*(undefined8 *)
                                       local_60._M_impl.super__Vector_impl_data._M_start >> 0x20),
                offset + (int)*(undefined8 *)local_60._M_impl.super__Vector_impl_data._M_start);
  iVar1 = this->control_;
  iVar2 = (*(this->super_QGate2<float>).super_QObject<float>._vptr_QObject[0xf])(this);
  iVar3 = (*(this->super_QGate2<float>).super_QObject<float>._vptr_QObject[0x10])(this);
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 0x38))
            (&local_70,(long *)CONCAT44(extraout_var,iVar3));
  lambda_QGate1<float>(&local_48,op,&local_70,*(float **)vector);
  std::unique_ptr<float[],_std::default_delete<float[]>_>::~unique_ptr(&local_70.data_);
  apply4<qclab::qgates::lambda_QGate1<float>(qclab::Op,qclab::dense::SquareMatrix<float>,float*)::_lambda(unsigned_long,unsigned_long)_1_>
            (nbQubits,*local_60._M_impl.super__Vector_impl_data._M_start,
             local_60._M_impl.super__Vector_impl_data._M_start[1],iVar1 + offset,iVar2 + offset,
             this->controlState_,&local_48);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_60);
  return;
}

Assistant:

void QControlledGate2< T >::apply( Op op ,
                                     const int nbQubits ,
                                     std::vector< T >& vector ,
                                     const int offset ) const {
    auto qubits = this->qubits() ;
    qubits[0] += offset ;
    qubits[1] += offset ;
    const int control = this->control() + offset ;
    const int target  = this->target()  + offset ;
    auto f = lambda_QGate1( op , this->gate()->matrix() , vector.data() ) ;
    apply4( nbQubits , qubits[0] , qubits[1] , control , target ,
            this->controlState() , f ) ;
  }